

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

void __thiscall miniros::MasterLink::set(MasterLink *this,string *key,RpcValue *v)

{
  int iVar1;
  Error EVar2;
  string *value;
  XmlRpcValue *pXVar3;
  iterator iVar4;
  mapped_type *this_00;
  mutex *__mutex;
  RpcValue params;
  RpcValue payload;
  RpcValue result;
  string mapped_key;
  XmlRpcValue local_98;
  string local_88;
  RpcValue local_68;
  RpcValue local_58;
  string local_48;
  
  if (this->internal_ != (Internal *)0x0) {
    names::resolve(&local_48,key,true);
    local_98._type = TypeInvalid;
    local_98._value.asDouble = 0.0;
    local_58._type = TypeInvalid;
    local_58._value.asDouble = 0.0;
    local_68._type = TypeInvalid;
    local_68._value.asDouble = 0.0;
    value = this_node::getName_abi_cxx11_();
    XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_88,value);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_98,0);
    XmlRpc::XmlRpcValue::operator=(pXVar3,(XmlRpcValue *)&local_88);
    XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_88);
    XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_88,&local_48);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_98,1);
    XmlRpc::XmlRpcValue::operator=(pXVar3,(XmlRpcValue *)&local_88);
    XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_88);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_98,2);
    XmlRpc::XmlRpcValue::operator=(pXVar3,v);
    __mutex = &this->internal_->params_mutex;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"setParam","");
    EVar2 = execute(this,&local_88,&local_98,&local_58,&local_68,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (EVar2.code == Ok) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->internal_->subscribed_params)._M_t,&local_48);
      if ((_Rb_tree_header *)iVar4._M_node !=
          &(this->internal_->subscribed_params)._M_t._M_impl.super__Rb_tree_header) {
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                  ::operator[](&this->internal_->params,&local_48);
        XmlRpc::XmlRpcValue::operator=(this_00,v);
      }
      invalidateParentParams(this,&local_48);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    XmlRpc::XmlRpcValue::invalidate(&local_68);
    XmlRpc::XmlRpcValue::invalidate(&local_58);
    XmlRpc::XmlRpcValue::invalidate(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void MasterLink::set(const std::string& key, const RpcValue& v)
{
  if (!internal_)
    return;

  std::string mapped_key = miniros::names::resolve(key);

  RpcValue params, result, payload;
  params[0] = this_node::getName();
  params[1] = mapped_key;
  params[2] = v;

  {
    // Lock around the execute to the master in case we get a parameter update on this value between
    // executing on the master and setting the parameter in the g_params list.
    std::scoped_lock<std::mutex> lock(internal_->params_mutex);

    if (this->execute("setParam", params, result, payload, true)) {
      // Update our cached params list now so that if get() is called immediately after param::set()
      // we already have the cached state and our value will be correct
      if (internal_->subscribed_params.find(mapped_key) != internal_->subscribed_params.end()) {
        internal_->params[mapped_key] = v;
      }
      invalidateParentParams(mapped_key);
    }
  }
}